

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAction::~IfcStructuralAction(IfcStructuralAction *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58;
  *(undefined8 *)&this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58 =
       0x8b8fd0;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x40 =
       0x8b90c0;
  *(undefined8 *)&this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xe0 =
       0x8b8ff8;
  this[-1].super_IfcStructuralActivity.super_IfcProduct.Representation.ptr.obj =
       (LazyObject *)0x8b9020;
  this[-1].super_IfcStructuralActivity.GlobalOrLocal.field_2._M_allocated_capacity = 0x8b9048;
  *(undefined8 *)&this[-1].field_0x158 = 0x8b9070;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject = 0x8b9098;
  puVar1 = *(undefined1 **)
            &(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this_00,&PTR_construction_vtable_24__008b90d8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcStructuralAction() : Object("IfcStructuralAction") {}